

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O3

void __thiscall
cfgfile::generator::cfg::tag_base_class_t::tag_base_class_t
          (tag_base_class_t *this,tag_t<cfgfile::string_trait_t> *owner,string *name,
          bool is_mandatory)

{
  _Rb_tree_header *p_Var1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  
  tag_t<cfgfile::string_trait_t>::tag_t
            ((tag_t<cfgfile::string_trait_t> *)this,owner,name,is_mandatory);
  (this->
  super_tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
  ).m_value._M_dataplus._M_p =
       (pointer)&(this->
                 super_tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
                 ).m_value.field_2;
  (this->
  super_tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
  ).m_value._M_string_length = 0;
  (this->
  super_tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
  ).m_value.field_2._M_local_buf[0] = '\0';
  (this->
  super_tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
  ).m_constraint =
       (constraint_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  (this->
  super_tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
  ).super_tag_t<cfgfile::string_trait_t>._vptr_tag_t = (_func_int **)&PTR__tag_base_class_t_0013e1e8
  ;
  tag_t<cfgfile::string_trait_t>::tag_t
            (&(this->m_value_type).super_tag_t<cfgfile::string_trait_t>,
             (tag_t<cfgfile::string_trait_t> *)this,(string_t *)c_value_type_tag_name_abi_cxx11_,
             false);
  (this->m_value_type).super_tag_t<cfgfile::string_trait_t>._vptr_tag_t =
       (_func_int **)&PTR__tag_scalar_t_0013e518;
  (this->m_value_type).m_value._M_dataplus._M_p = (pointer)&(this->m_value_type).m_value.field_2;
  (this->m_value_type).m_value._M_string_length = 0;
  (this->m_value_type).m_value.field_2._M_local_buf[0] = '\0';
  (this->m_value_type).m_constraint =
       (constraint_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  (this->m_constraint).
  super_constraint_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._vptr_constraint_t = (_func_int **)&PTR__constraint_one_of_t_0013e670;
  p_Var1 = &(this->m_constraint).m_list._M_t._M_impl.super__Rb_tree_header;
  (this->m_constraint).m_list._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_constraint).m_list._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_constraint).m_list._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_constraint).m_list._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_constraint).m_list._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  tag_t<cfgfile::string_trait_t>::tag_t
            (&(this->m_name).super_tag_t<cfgfile::string_trait_t>,
             (tag_t<cfgfile::string_trait_t> *)this,(string_t *)c_field_name_tag_name_abi_cxx11_,
             false);
  (this->m_name).super_tag_t<cfgfile::string_trait_t>._vptr_tag_t =
       (_func_int **)&PTR__tag_scalar_t_0013e518;
  (this->m_name).m_value._M_dataplus._M_p = (pointer)&(this->m_name).m_value.field_2;
  (this->m_name).m_value._M_string_length = 0;
  (this->m_name).m_value.field_2._M_local_buf[0] = '\0';
  (this->m_name).m_constraint =
       (constraint_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  tag_min_max_constraint_t::tag_min_max_constraint_t
            (&this->m_min_max_constraint,(tag_t<cfgfile::string_trait_t> *)this);
  tag_t<cfgfile::string_trait_t>::tag_t
            ((tag_t<cfgfile::string_trait_t> *)&this->m_one_of_constraint,
             (tag_t<cfgfile::string_trait_t> *)this,
             (string_t *)c_one_of_constraint_tag_name_abi_cxx11_,false);
  (this->m_one_of_constraint).
  super_tag_scalar_vector_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
  .m_values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_one_of_constraint).
  super_tag_scalar_vector_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
  .m_constraint =
       (constraint_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  (this->m_one_of_constraint).
  super_tag_scalar_vector_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
  .m_values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_one_of_constraint).
  super_tag_scalar_vector_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
  .m_values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_one_of_constraint).
  super_tag_scalar_vector_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
  .super_tag_t<cfgfile::string_trait_t>._vptr_tag_t =
       (_func_int **)&PTR__tag_one_of_constraint_t_0013e158;
  tag_t<cfgfile::string_trait_t>::tag_t
            (&(this->m_is_required).super_tag_t<cfgfile::string_trait_t>,
             (tag_t<cfgfile::string_trait_t> *)this,(string_t *)c_required_tag_name_abi_cxx11_,false
            );
  (this->m_is_required).super_tag_t<cfgfile::string_trait_t>._vptr_tag_t =
       (_func_int **)&PTR__tag_t_0013e488;
  tag_t<cfgfile::string_trait_t>::tag_t
            (&(this->m_default_value).super_tag_t<cfgfile::string_trait_t>,
             (tag_t<cfgfile::string_trait_t> *)this,(string_t *)c_default_value_tag_name_abi_cxx11_,
             false);
  (this->m_default_value).super_tag_t<cfgfile::string_trait_t>._vptr_tag_t =
       (_func_int **)&PTR__tag_scalar_t_0013e518;
  (this->m_default_value).m_value._M_dataplus._M_p =
       (pointer)&(this->m_default_value).m_value.field_2;
  (this->m_default_value).m_value._M_string_length = 0;
  (this->m_default_value).m_value.field_2._M_local_buf[0] = '\0';
  (this->m_default_value).m_constraint =
       (constraint_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  this_00 = &(this->m_constraint).m_list;
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_00,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &c_scalar_tag_name_abi_cxx11_);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_00,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &c_no_value_tag_name_abi_cxx11_);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_00,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &c_scalar_vector_tag_name_abi_cxx11_);
  (this->
  super_tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
  ).m_constraint =
       &(this->m_constraint).
        super_constraint_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ;
  return;
}

Assistant:

tag_base_class_t::tag_base_class_t(
	cfgfile::tag_t< cfgfile::string_trait_t > & owner,
	const std::string & name, bool is_mandatory )
	:	cfgfile::tag_scalar_t< std::string > ( owner, name, is_mandatory )
	,	m_value_type( *this, c_value_type_tag_name, false )
	,	m_name( *this, c_field_name_tag_name, false )
	,	m_min_max_constraint( *this )
	,	m_one_of_constraint( *this )
	,	m_is_required( *this, c_required_tag_name, false )
	,	m_default_value( *this, c_default_value_tag_name, false )
{
	m_constraint.add_value( c_scalar_tag_name );
	m_constraint.add_value( c_no_value_tag_name );
	m_constraint.add_value( c_scalar_vector_tag_name );

	set_constraint( &m_constraint );
}